

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZXAlgorithms.h
# Opt level: O0

string * ZXing::ToString<unsigned_int,void>(uint val,int len)

{
  undefined8 uVar1;
  int in_EDX;
  uint in_ESI;
  string *in_RDI;
  string *result;
  allocator<char> *in_stack_ffffffffffffff38;
  string *msg;
  Type in_stack_ffffffffffffff45;
  ushort in_stack_ffffffffffffff46;
  char *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  undefined1 uVar2;
  allocator<char> *in_stack_ffffffffffffff60;
  string *this;
  string local_71 [2];
  allocator<char> local_12;
  undefined1 local_11;
  int local_10;
  uint local_c;
  
  local_11 = 0;
  local_10 = in_EDX + -1;
  this = in_RDI;
  local_c = in_ESI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
             (size_type)in_stack_ffffffffffffff48,(char)(in_stack_ffffffffffffff46 >> 8),
             in_stack_ffffffffffffff38);
  std::allocator<char>::~allocator(&local_12);
  for (; uVar2 = -1 < local_10 && local_c != 0, -1 < local_10 && local_c != 0;
      local_10 = local_10 + -1) {
    in_stack_ffffffffffffff46 =
         CONCAT11((char)local_c + (char)(local_c / 10) * -10,(char)in_stack_ffffffffffffff46) |
         0x3000;
    in_stack_ffffffffffffff48 = (char *)std::__cxx11::string::operator[]((ulong)this);
    *in_stack_ffffffffffffff48 = (char)(in_stack_ffffffffffffff46 >> 8);
    local_c = local_c / 10;
  }
  if (local_c != 0) {
    uVar1 = __cxa_allocate_exception(0x30);
    msg = local_71;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (this,(char *)in_RDI,in_stack_ffffffffffffff60);
    Error::Error((Error *)CONCAT17(uVar2,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48,
                 in_stack_ffffffffffffff46,in_stack_ffffffffffffff45,msg);
    __cxa_throw(uVar1,&Error::typeinfo,Error::~Error);
  }
  return in_RDI;
}

Assistant:

std::string ToString(T val, int len)
{
	std::string result(len--, '0');
	if (val < 0)
		throw FormatError("Invalid value");
	for (; len >= 0 && val != 0; --len, val /= 10)
		result[len] = '0' + val % 10;
	if (val)
		throw FormatError("Invalid value");
	return result;
}